

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall
CVmConsole::open_script_file(CVmConsole *this,char *fname,int quiet,int script_more_mode)

{
  undefined8 uVar1;
  void *pvVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  char *in_RSI;
  err_frame_t err_cur__;
  CVmNetFile *nf;
  uint local_100 [2];
  undefined8 local_f8;
  void *local_f0;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  vm_val_t *in_stack_ffffffffffffff70;
  CVmNetFile *in_stack_ffffffffffffff78;
  CVmConsole *in_stack_ffffffffffffff80;
  
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  local_f8 = *puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)local_100;
  local_100[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffff18);
  if (local_100[0] == 0) {
    CVmNetFile::open(in_RSI,0,1,5,"text/plain");
  }
  uVar1 = local_f8;
  if (local_100[0] == 1) {
    local_100[0] = 2;
  }
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = uVar1;
  if ((local_100[0] & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pvVar2 = local_f0;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar5 + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_100[0] & 2) != 0) {
    free(local_f0);
  }
  iVar3 = open_script_file(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                           in_stack_ffffffffffffff68);
  return iVar3;
}

Assistant:

int CVmConsole::open_script_file(VMG_ const char *fname,
                                 int quiet, int script_more_mode)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(
            vmg_ fname, 0, NETF_READ, OSFTCMD, "text/plain");
    }